

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  long *plVar3;
  UnifiedVectorFormat *count;
  ulong uVar4;
  reference vector;
  reference vector_00;
  long lVar5;
  long lVar6;
  UnifiedVectorFormat *pUVar7;
  long lVar8;
  long lVar9;
  UnifiedVectorFormat *pUVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  VectorType VVar14;
  undefined8 *puVar15;
  idx_t i;
  UnifiedVectorFormat *pUVar16;
  TemplatedValidityMask<unsigned_long> *pTVar17;
  idx_t i_1;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar14 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar14);
    plVar3 = *(long **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      lVar5 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                        (**(undefined8 **)(vector + 0x20),(*(undefined8 **)(vector + 0x20))[1],
                         **(undefined8 **)(vector_00 + 0x20),result + 0x28,0);
      *plVar3 = lVar5;
      return;
    }
  }
  else {
    count = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar5 = *(long *)(vector + 0x20);
      puVar13 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar14);
        lVar8 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
        if (*(long *)(result + 0x28) == 0) {
          puVar15 = (undefined8 *)(lVar5 + 8);
          for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
            lVar5 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                              (puVar15[-1],*puVar15,*puVar13,pTVar17,pUVar16);
            *(long *)(lVar8 + (long)pUVar16 * 8) = lVar5;
            puVar15 = puVar15 + 2;
          }
          return;
        }
        lVar5 = lVar5 + 8;
        uVar12 = 0;
        pUVar16 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar12 == (ulong)(count + 0x3f) >> 6) {
            return;
          }
          if (pTVar17->validity_mask == (unsigned_long *)0x0) {
            pUVar7 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar7 = count;
            }
LAB_0068ff7f:
            puVar15 = (undefined8 *)((long)pUVar16 * 0x10 + lVar5);
            for (; pUVar10 = pUVar16, pUVar16 < pUVar7; pUVar16 = pUVar16 + 1) {
              lVar6 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                (puVar15[-1],*puVar15,*puVar13,pTVar17,pUVar16);
              *(long *)(lVar8 + (long)pUVar16 * 8) = lVar6;
              puVar15 = puVar15 + 2;
            }
          }
          else {
            uVar4 = pTVar17->validity_mask[uVar12];
            pUVar7 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar7 = count;
            }
            if (uVar4 == 0xffffffffffffffff) goto LAB_0068ff7f;
            pUVar10 = pUVar7;
            if (uVar4 != 0) {
              puVar15 = (undefined8 *)((long)pUVar16 * 0x10 + lVar5);
              for (uVar11 = 0; pUVar10 = pUVar16 + uVar11, pUVar16 + uVar11 < pUVar7;
                  uVar11 = uVar11 + 1) {
                if ((uVar4 >> (uVar11 & 0x3f) & 1) != 0) {
                  lVar6 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                    (puVar15[-1],*puVar15,*puVar13,pTVar17);
                  *(long *)(lVar8 + (long)pUVar16 * 8 + uVar11 * 8) = lVar6;
                }
                puVar15 = puVar15 + 2;
              }
            }
          }
          uVar12 = uVar12 + 1;
          pUVar16 = pUVar10;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar5 = *(long *)(vector + 0x20);
          lVar8 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar14);
          lVar6 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
          lVar9 = *(long *)(result + 0x28);
          FlatVector::VerifyFlatVector(vector_00);
          if (lVar9 == 0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),
                       (idx_t)count);
          }
          else {
            duckdb::ValidityMask::Combine((ValidityMask *)pTVar17,(ulong)(vector_00 + 0x28));
          }
          if (pTVar17->validity_mask == (unsigned_long *)0x0) {
            puVar13 = (undefined8 *)(lVar5 + 8);
            for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
              lVar5 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                (puVar13[-1],*puVar13,*(undefined8 *)(lVar8 + (long)pUVar16 * 8),
                                 pTVar17,pUVar16);
              *(long *)(lVar6 + (long)pUVar16 * 8) = lVar5;
              puVar13 = puVar13 + 2;
            }
          }
          else {
            lVar5 = lVar5 + 8;
            pUVar16 = (UnifiedVectorFormat *)0x0;
            for (uVar12 = 0; uVar12 != (ulong)(count + 0x3f) >> 6; uVar12 = uVar12 + 1) {
              if (pTVar17->validity_mask == (unsigned_long *)0x0) {
                pUVar7 = pUVar16 + 0x40;
                if (count <= pUVar16 + 0x40) {
                  pUVar7 = count;
                }
LAB_006904f6:
                puVar13 = (undefined8 *)((long)pUVar16 * 0x10 + lVar5);
                for (; pUVar10 = pUVar16, pUVar16 < pUVar7; pUVar16 = pUVar16 + 1) {
                  lVar9 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                    (puVar13[-1],*puVar13,*(undefined8 *)(lVar8 + (long)pUVar16 * 8)
                                     ,pTVar17,pUVar16);
                  *(long *)(lVar6 + (long)pUVar16 * 8) = lVar9;
                  puVar13 = puVar13 + 2;
                }
              }
              else {
                uVar4 = pTVar17->validity_mask[uVar12];
                pUVar7 = pUVar16 + 0x40;
                if (count <= pUVar16 + 0x40) {
                  pUVar7 = count;
                }
                if (uVar4 == 0xffffffffffffffff) goto LAB_006904f6;
                pUVar10 = pUVar7;
                if (uVar4 != 0) {
                  puVar13 = (undefined8 *)((long)pUVar16 * 0x10 + lVar5);
                  for (uVar11 = 0; pUVar10 = pUVar16 + uVar11, pUVar10 < pUVar7; uVar11 = uVar11 + 1
                      ) {
                    if ((uVar4 >> (uVar11 & 0x3f) & 1) != 0) {
                      lVar9 = BinaryLambdaWrapperWithNulls::
                              Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                        (puVar13[-1],*puVar13,
                                         *(undefined8 *)(lVar8 + (long)pUVar16 * 8 + uVar11 * 8),
                                         pTVar17);
                      *(long *)(lVar6 + (long)pUVar16 * 8 + uVar11 * 8) = lVar9;
                    }
                    puVar13 = puVar13 + 2;
                  }
                }
              }
              pUVar16 = pUVar10;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,count);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,count);
          duckdb::Vector::SetVectorType(VVar14);
          lVar5 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
          if (local_b0 == 0 && local_68 == 0) {
            for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
              pUVar7 = pUVar16;
              if (*_ldata != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar16 * 4);
              }
              pUVar10 = pUVar16;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar16 * 4);
              }
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                (*(undefined8 *)(local_70 + (long)pUVar7 * 0x10),
                                 *(undefined8 *)(local_70 + 8 + (long)pUVar7 * 0x10),
                                 *(undefined8 *)(local_b8 + (long)pUVar10 * 8),pTVar17,pUVar16);
              *(long *)(lVar5 + (long)pUVar16 * 8) = lVar8;
            }
          }
          else {
            for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
              pUVar7 = pUVar16;
              if (*_ldata != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar16 * 4);
              }
              pUVar10 = pUVar16;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar16 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
                   != 0)))) {
                lVar8 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                  (*(undefined8 *)(local_70 + (long)pUVar7 * 0x10),
                                   *(undefined8 *)(local_70 + 8 + (long)pUVar7 * 0x10),
                                   *(undefined8 *)(local_b8 + (long)pUVar10 * 8),pTVar17,pUVar16);
                *(long *)(lVar5 + (long)pUVar16 * 8) = lVar8;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid(pTVar17,(idx_t)pUVar16);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      puVar13 = *(undefined8 **)(vector + 0x20);
      lVar5 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar14);
        lVar8 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),(idx_t)count);
        if (*(long *)(result + 0x28) == 0) {
          for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
            lVar6 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                              (*puVar13,puVar13[1],*(undefined8 *)(lVar5 + (long)pUVar16 * 8),
                               pTVar17,pUVar16);
            *(long *)(lVar8 + (long)pUVar16 * 8) = lVar6;
          }
          return;
        }
        uVar12 = 0;
        pUVar16 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar12 == (ulong)(count + 0x3f) >> 6) {
            return;
          }
          if (pTVar17->validity_mask == (unsigned_long *)0x0) {
            pUVar7 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar7 = count;
            }
LAB_00690249:
            for (; pUVar10 = pUVar16, pUVar16 < pUVar7; pUVar16 = pUVar16 + 1) {
              lVar6 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                (*puVar13,puVar13[1],*(undefined8 *)(lVar5 + (long)pUVar16 * 8),
                                 pTVar17,pUVar16);
              *(long *)(lVar8 + (long)pUVar16 * 8) = lVar6;
            }
          }
          else {
            uVar4 = pTVar17->validity_mask[uVar12];
            pUVar7 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar7 = count;
            }
            if (uVar4 == 0xffffffffffffffff) goto LAB_00690249;
            pUVar10 = pUVar7;
            if (uVar4 != 0) {
              for (uVar11 = 0; pUVar10 = pUVar16 + uVar11, pUVar10 < pUVar7; uVar11 = uVar11 + 1) {
                if ((uVar4 >> (uVar11 & 0x3f) & 1) != 0) {
                  lVar6 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                    (*puVar13,puVar13[1],
                                     *(undefined8 *)(lVar5 + (long)pUVar16 * 8 + uVar11 * 8),pTVar17
                                    );
                  *(long *)(lVar8 + (long)pUVar16 * 8 + uVar11 * 8) = lVar6;
                }
              }
            }
          }
          uVar12 = uVar12 + 1;
          pUVar16 = pUVar10;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar14);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}